

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlayerDriver.cpp
# Opt level: O2

bool test_Player_getOwnedCountries(bool verbose)

{
  pointer ppCVar1;
  pointer ppCVar2;
  pointer ppCVar3;
  vector<Map::Country_*,_std::allocator<Map::Country_*>_> *this;
  Hand *this_00;
  DiceRoller *this_01;
  Player *this_02;
  ostream *poVar4;
  pointer ppCVar5;
  Country *pCountry3;
  Country *pCountry2;
  Country *pCountry1;
  string local_140;
  string local_120;
  string local_100;
  string local_e0;
  Country country3;
  Country country2;
  Country country1;
  
  this = (vector<Map::Country_*,_std::allocator<Map::Country_*>_> *)operator_new(0x18);
  (this->super__Vector_base<Map::Country_*,_std::allocator<Map::Country_*>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->super__Vector_base<Map::Country_*,_std::allocator<Map::Country_*>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->super__Vector_base<Map::Country_*,_std::allocator<Map::Country_*>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_100,"country1",(allocator<char> *)&country2);
  Map::Country::Country(&country1,0,&local_100,0);
  std::__cxx11::string::~string((string *)&local_100);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_120,"country2",(allocator<char> *)&country3);
  Map::Country::Country(&country2,1,&local_120,0);
  std::__cxx11::string::~string((string *)&local_120);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_140,"country3",(allocator<char> *)&local_e0);
  Map::Country::Country(&country3,3,&local_140,1);
  std::__cxx11::string::~string((string *)&local_140);
  pCountry3 = &country3;
  pCountry2 = &country2;
  pCountry1 = &country1;
  std::vector<Map::Country_*,_std::allocator<Map::Country_*>_>::push_back(this,&pCountry1);
  std::vector<Map::Country_*,_std::allocator<Map::Country_*>_>::push_back(this,&pCountry2);
  std::vector<Map::Country_*,_std::allocator<Map::Country_*>_>::push_back(this,&pCountry3);
  this_00 = (Hand *)operator_new(8);
  Hand::Hand(this_00);
  this_01 = (DiceRoller *)operator_new(0x10);
  DiceRoller::DiceRoller(this_01);
  this_02 = (Player *)operator_new(0x38);
  Player::Player(this_02,this,this_00,this_01,0);
  ppCVar1 = (this_02->pOwnedCountries->
            super__Vector_base<Map::Country_*,_std::allocator<Map::Country_*>_>)._M_impl.
            super__Vector_impl_data._M_start;
  ppCVar2 = (this_02->pOwnedCountries->
            super__Vector_base<Map::Country_*,_std::allocator<Map::Country_*>_>)._M_impl.
            super__Vector_impl_data._M_finish;
  if (verbose) {
    std::operator<<((ostream *)&std::cout,"\x1b[35m");
    std::operator<<((ostream *)&std::cout,"\nThe player owns countries: ");
    ppCVar3 = (this_02->pOwnedCountries->
              super__Vector_base<Map::Country_*,_std::allocator<Map::Country_*>_>)._M_impl.
              super__Vector_impl_data._M_finish;
    for (ppCVar5 = (this_02->pOwnedCountries->
                   super__Vector_base<Map::Country_*,_std::allocator<Map::Country_*>_>)._M_impl.
                   super__Vector_impl_data._M_start; ppCVar5 != ppCVar3; ppCVar5 = ppCVar5 + 1) {
      Map::Country::getCountryName_abi_cxx11_(&local_e0,*ppCVar5);
      poVar4 = std::operator<<((ostream *)&std::cout,(string *)&local_e0);
      std::operator<<(poVar4," ");
      std::__cxx11::string::~string((string *)&local_e0);
    }
    poVar4 = std::operator<<((ostream *)&std::cout,"\x1b[31m");
    std::endl<char,std::char_traits<char>>(poVar4);
  }
  Player::~Player(this_02);
  operator_delete(this_02,0x38);
  Map::Country::~Country(&country3);
  Map::Country::~Country(&country2);
  Map::Country::~Country(&country1);
  return ppCVar1 != ppCVar2;
}

Assistant:

bool test_Player_getOwnedCountries(bool verbose = false) {

    // Arrange
    bool success = true;
    auto* ownedCountries1 = new std::vector<Map::Country*>();
    Map::Country country1 = Map::Country(0, "country1", 0);
    Map::Country country2 = Map::Country(1, "country2", 0);
    Map::Country country3 = Map::Country(3, "country3", 1);
    Map::Country* pCountry1 = &country1;
    Map::Country* pCountry2 = &country2;
    Map::Country* pCountry3 = &country3;
    ownedCountries1->push_back(pCountry1);
    ownedCountries1->push_back(pCountry2);
    ownedCountries1->push_back(pCountry3);
    auto* cards = new Hand();
    auto* diceRoller = new DiceRoller();

    // Act
    auto* player1 = new Player(ownedCountries1, cards, diceRoller, 0);

    // Assert
    if (player1->getOwnedCountries()->empty()) {
        success = false;
    }
    if (verbose) {
        std::cout << "\033[35m";
        std::cout << "\nThe player owns countries: ";
        for (auto& i : *player1->getOwnedCountries()) {
            std::cout << i->getCountryName() << " ";
        }
        std::cout << "\033[31m" << std::endl;
    }
    delete player1;
    return success;
}